

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

PixelSensor * pbrt::PixelSensor::CreateDefault(Allocator alloc)

{
  PixelSensor *pPVar1;
  ParameterDictionary local_78;
  
  local_78.params.field_2.fixed[0] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[1] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[2] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[3] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[4] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[5] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[6] = (ParsedParameter *)0x0;
  local_78.params.field_2.fixed[7] = (ParsedParameter *)0x0;
  local_78.params.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_78.params.ptr = (ParsedParameter **)0x0;
  local_78.colorSpace = (RGBColorSpace *)0x0;
  local_78.params.nAlloc = 0;
  local_78.params.nStored = 0;
  pPVar1 = Create(&local_78,RGBColorSpace::sRGB,1.0,(FileLoc *)0x0,alloc);
  local_78.params.nStored = 0;
  (*(local_78.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_78.params.alloc.memoryResource,local_78.params.ptr,local_78.params.nAlloc << 3,8)
  ;
  return pPVar1;
}

Assistant:

PixelSensor *PixelSensor::CreateDefault(Allocator alloc) {
    return Create(ParameterDictionary(), RGBColorSpace::sRGB, 1.0, nullptr, alloc);
}